

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void yindex(LexState *ls,expdesc *v)

{
  FuncState *in_RSI;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  luaX_next((LexState *)0x118208);
  expr((LexState *)in_RSI,(expdesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  luaK_exp2val(in_RSI,(expdesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  checknext((LexState *)in_RSI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

static void yindex(LexState*ls,expdesc*v){
luaX_next(ls);
expr(ls,v);
luaK_exp2val(ls->fs,v);
checknext(ls,']');
}